

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O0

Clause * __thiscall
Shell::EqualityProxyMono::createEqProxyAxiom(EqualityProxyMono *this,LiteralStack *literalStack)

{
  bool bVar1;
  Clause *pCVar2;
  Clause *res;
  Unit *prem;
  TermList srt;
  Literal *l;
  ConstIterator it;
  UnitList *prems;
  DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> sorts;
  DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffee8;
  TermList in_stack_fffffffffffffef0;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffef8;
  TermList in_stack_ffffffffffffff00;
  NonspecificInferenceMany local_d8 [3];
  Inference *in_stack_ffffffffffffff58;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff60;
  TermList local_70;
  Term *local_68;
  ConstRefIterator local_50;
  UnitList *local_40;
  
  Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHSet
            ((DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)0xb90c84);
  local_40 = (UnitList *)0x0;
  Lib::Stack<Kernel::Literal_*>::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_fffffffffffffef0._content,
             (Stack<Kernel::Literal_*> *)in_stack_fffffffffffffee8);
  while (bVar1 = Lib::Stack<Kernel::Literal_*>::ConstRefIterator::hasNext(&local_50), bVar1) {
    local_68 = &Lib::Stack<Kernel::Literal_*>::ConstIterator::next((ConstIterator *)0xb90cd6)->
                super_Term;
    Kernel::TermList::TermList(&local_70);
    Kernel::Term::functor(local_68);
    bVar1 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                      (in_stack_fffffffffffffef8,(uint *)in_stack_fffffffffffffef0._content,
                       (TermList *)in_stack_fffffffffffffee8);
    if ((((bVar1 ^ 0xffU) & 1) == 0) &&
       (bVar1 = Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                          ((DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                           in_stack_fffffffffffffef8,in_stack_ffffffffffffff00), bVar1)) {
      Lib::DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
      Lib::List<Kernel::Unit_*>::push
                ((Unit *)in_stack_fffffffffffffef0._content,
                 (List<Kernel::Unit_*> **)in_stack_fffffffffffffee8);
    }
  }
  Kernel::NonspecificInferenceMany::NonspecificInferenceMany
            (local_d8,EQUALITY_PROXY_AXIOM2,local_40);
  Kernel::Inference::Inference
            ((Inference *)in_stack_fffffffffffffef0._content,
             (NonspecificInferenceMany *)in_stack_fffffffffffffee8);
  pCVar2 = Kernel::Clause::fromStack(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  Kernel::Inference::~Inference((Inference *)(local_d8 + 1));
  Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet
            ((DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)0xb90e72);
  return pCVar2;
}

Assistant:

Clause* EqualityProxyMono::createEqProxyAxiom(const LiteralStack& literalStack)
{
  DHSet<TermList> sorts;
  UnitList* prems = 0;

  LiteralStack::ConstIterator it(literalStack);
  while (it.hasNext()) {
    Literal* l = it.next();
    TermList srt;
    if (!s_proxyPredicateSorts.find(l->functor(),srt)) {
      continue;
    }
    if (!sorts.insert(srt)) {
      continue;
    }
    Unit* prem = s_proxyPremises.get(srt);
    ASS(prem);
    UnitList::push(prem, prems);
  }
  ASS(prems);
  Clause* res = Clause::fromStack(literalStack,NonspecificInferenceMany(InferenceRule::EQUALITY_PROXY_AXIOM2,prems));
  return res;
}